

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
EmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(EmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  result_type_conflict1 rVar1;
  mt19937_64 *__urng;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  T val2;
  T val;
  TypeParam m;
  AssertHelper local_540;
  AssertHelper local_538;
  undefined1 local_530 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  anon_union_8_1_a8a14541_for_iterator_1 local_518;
  undefined1 local_4f8 [8];
  _Alloc_hider local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  result_type_conflict1 local_4d0 [2];
  pair<const_phmap::priv::NonStandardLayout,_int> local_4c8;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_498;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_4c8,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)&local_498);
  lVar2 = 0x40;
  do {
    *(undefined8 *)((long)&local_4c8.first._vptr_NonStandardLayout + lVar2) = 0;
    *(undefined8 *)((long)local_498.sets_._M_elems + lVar2 + -0x28) = 0;
    *(undefined8 *)((long)local_4d0 + lVar2 + -8) = 0;
    *(undefined8 *)((long)local_4d0 + lVar2) = 0;
    *(undefined8 *)((long)local_498.sets_._M_elems + lVar2 + -0x18) = 0;
    *(long *)((long)local_498.sets_._M_elems + lVar2 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_498.sets_._M_elems + lVar2 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_498.sets_._M_elems[0].set_.ctrl_ + lVar2) = 0;
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x4c0);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::emplace<std::pair<const_phmap::priv::NonStandardLayout,_int>_&,_0>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
              *)local_530,&local_498,&local_4c8);
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::NonStandardLayout_const,int>,std::pair<phmap::priv::NonStandardLayout_const,int>>
            ((internal *)local_530,"val","*it",&local_4c8,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)local_518.slot_);
  if (local_530[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if (local_528 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_528->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=(&local_540,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_4f8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_4f8 + 8))();
    }
  }
  if (local_528 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_528,local_528);
  }
  local_530._0_4_ = 0;
  local_530._4_4_ = 0x7fffffff;
  __urng = hash_internal::GetSharedRng();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)local_530,__urng,(param_type *)local_530);
  local_4f8 = (undefined1  [8])&PTR__NonStandardLayout_0034a128;
  local_4f0._M_p = (pointer)&local_4e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f0,local_4c8.first.value._M_dataplus._M_p,
             local_4c8.first.value._M_dataplus._M_p + local_4c8.first.value._M_string_length);
  local_4d0[0] = rVar1;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::emplace<std::pair<const_phmap::priv::NonStandardLayout,_int>_&,_0>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
              *)local_530,&local_498,(pair<const_phmap::priv::NonStandardLayout,_int> *)local_4f8);
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::NonStandardLayout_const,int>,std::pair<phmap::priv::NonStandardLayout_const,int>>
            ((internal *)local_530,"val","*it",&local_4c8,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)local_518.slot_);
  if (local_530[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_540);
    if (local_528 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_528->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x9b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_538,(Message *)&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    if (local_540.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_540.data_ + 8))();
    }
  }
  if (local_528 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_528,local_528);
  }
  local_4f8 = (undefined1  [8])&PTR__NonStandardLayout_0034a128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_p != &local_4e0) {
    operator_delete(local_4f0._M_p,local_4e0._M_allocated_capacity + 1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~parallel_hash_set(&local_498);
  local_4c8.first._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_0034a128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first.value._M_dataplus._M_p != &local_4c8.first.value.field_2) {
    operator_delete(local_4c8.first.value._M_dataplus._M_p,
                    local_4c8.first.value.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, EmplaceHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto it = m.emplace_hint(m.end(), val);
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.emplace_hint(it, val2);
  EXPECT_EQ(val, *it);
}